

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O0

mr_result miller_rabin_test_inner(MillerRabin *mr,mp_int *mw)

{
  mr_result mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  mp_int *pmVar5;
  size_t sVar6;
  mp_int *x;
  mp_int *b;
  uint is_minus_1;
  uint is_plus_1;
  uint first_iter;
  uint active;
  size_t bit;
  mp_int *spare;
  mp_int *acc;
  mp_int *mw_local;
  MillerRabin *mr_local;
  mr_result result;
  
  pmVar5 = monty_identity(mr->mc);
  pmVar5 = mp_copy(pmVar5);
  sVar6 = mp_max_bits(mr->pm1);
  x = mp_new(sVar6);
  _first_iter = mp_max_bits(mr->pm1);
  is_plus_1 = 0;
  mr_local._4_4_ = 0;
  mr_local._0_4_ = 0;
  while (sVar6 = _first_iter - 1, 1 < _first_iter) {
    monty_mul_into(mr->mc,pmVar5,pmVar5,pmVar5);
    monty_mul_into(mr->mc,x,pmVar5,mw);
    uVar2 = mp_get_bit(mr->pm1,sVar6);
    mp_select_into(pmVar5,pmVar5,x,uVar2);
    uVar2 = mp_get_bit(mr->lowbit,sVar6);
    is_plus_1 = uVar2 | is_plus_1;
    b = monty_identity(mr->mc);
    uVar3 = mp_cmp_eq(pmVar5,b);
    uVar4 = mp_cmp_eq(pmVar5,mr->m_pm1);
    mr_local._0_4_ = is_plus_1 & uVar4 | uVar2 & uVar3 | (uint)mr_local;
    _first_iter = sVar6;
    if (sVar6 == 1) {
      mr_local._4_4_ = uVar4;
    }
  }
  mp_free(pmVar5);
  mp_free(x);
  mVar1.potential_primitive_root = mr_local._4_4_;
  mVar1.passed = (uint)mr_local;
  return mVar1;
}

Assistant:

static struct mr_result miller_rabin_test_inner(MillerRabin *mr, mp_int *mw)
{
    mp_int *acc = mp_copy(monty_identity(mr->mc));
    mp_int *spare = mp_new(mp_max_bits(mr->pm1));
    size_t bit = mp_max_bits(mr->pm1);

    /*
     * The obvious approach to Miller-Rabin would be to start by
     * calling monty_pow to raise w to the power q, and then square it
     * k times ourselves. But that introduces a timing leak that gives
     * away the value of k, i.e., how many factors of 2 there are in
     * p-1.
     *
     * Instead, we don't call monty_pow at all. We do a modular
     * exponentiation ourselves to compute w^((p-1)/2), using the
     * technique that works from the top bit of the exponent
     * downwards. That is, in each iteration we compute
     * w^floor(exponent/2^i) for i one less than the previous
     * iteration, by squaring the value we previously had and then
     * optionally multiplying in w if the next exponent bit is 1.
     *
     * At the end of that process, once i <= k, the division
     * (exponent/2^i) yields an integer, so the values we're computing
     * are not just w^(floor of that), but w^(exactly that). In other
     * words, the last k intermediate values of this modexp are
     * precisely the values M-R wants to check against +1 or -1.
     *
     * So we interleave those checks with the modexp loop itself, and
     * to avoid a timing leak, we check _every_ intermediate result
     * against (the Montgomery representations of) both +1 and -1. And
     * then we do bitwise masking to arrange that only the sensible
     * ones of those checks find their way into our final answer.
     */

    unsigned active = 0;

    struct mr_result result;
    result.passed = result.potential_primitive_root = 0;

    while (bit-- > 1) {
        /*
         * In this iteration, we're computing w^(2e) or w^(2e+1),
         * where we have w^e from the previous iteration. So we square
         * the value we had already, and then optionally multiply in
         * another copy of w depending on the next bit of the exponent.
         */
        monty_mul_into(mr->mc, acc, acc, acc);
        monty_mul_into(mr->mc, spare, acc, mw);
        mp_select_into(acc, acc, spare, mp_get_bit(mr->pm1, bit));

        /*
         * mr->lowbit is a number with only one bit set, corresponding
         * to the lowest set bit in p-1. So when that's the bit of the
         * exponent we've just processed, we'll detect it by setting
         * first_iter to true. That's our indication that we're now
         * generating intermediate results useful to M-R, so we also
         * set 'active', which stays set from then on.
         */
        unsigned first_iter = mp_get_bit(mr->lowbit, bit);
        active |= first_iter;

        /*
         * Check the intermediate result against both +1 and -1.
         */
        unsigned is_plus_1 = mp_cmp_eq(acc, monty_identity(mr->mc));
        unsigned is_minus_1 = mp_cmp_eq(acc, mr->m_pm1);

        /*
         * M-R must report success iff either: the first of the useful
         * intermediate results (which is w^q) is 1, or _any_ of them
         * (from w^q all the way up to w^((p-1)/2)) is -1.
         *
         * So we want to pass the test if is_plus_1 is set on the
         * first iteration, or if is_minus_1 is set on any iteration.
         */
        result.passed |= (first_iter & is_plus_1);
        result.passed |= (active & is_minus_1);

        /*
         * In the final iteration, is_minus_1 is also used to set the
         * 'potential primitive root' flag, because we haven't found
         * any exponent smaller than p-1 for which w^(that) == 1.
         */
        if (bit == 1)
            result.potential_primitive_root = is_minus_1;
    }

    mp_free(acc);
    mp_free(spare);

    return result;
}